

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

size_t __thiscall caffe::NetState::ByteSizeLong(NetState *this)

{
  uint uVar1;
  UnknownFieldSet *unknown_fields;
  Type *value;
  size_t sVar2;
  uint uVar3;
  size_t sVar4;
  uint index;
  
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar4 = 0;
  }
  else {
    unknown_fields = NetState::unknown_fields(this);
    sVar4 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar1 = (this->stage_).super_RepeatedPtrFieldBase.current_size_;
  sVar4 = sVar4 + uVar1;
  uVar3 = 0;
  index = 0;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
    index = 0;
  }
  for (; uVar3 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      (&(this->stage_).super_RepeatedPtrFieldBase,index);
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sVar4 = sVar4 + sVar2;
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->level_);
      sVar4 = sVar4 + sVar2 + 1;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->phase_);
      sVar4 = sVar4 + sVar2 + 1;
    }
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t NetState::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.NetState)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated string stage = 3;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->stage_size());
  for (int i = 0, n = this->stage_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->stage(i));
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional int32 level = 2 [default = 0];
    if (has_level()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->level());
    }

    // optional .caffe.Phase phase = 1 [default = TEST];
    if (has_phase()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->phase());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}